

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void r4k_helper_tlbinv_mipsel(CPUMIPSState_conflict2 *env)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CPUMIPSTLBContext_conflict *pCVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar2 = env->CP0_Config5;
  if ((uVar2 >> 0x11 & 1) == 0) {
    uVar3 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  }
  else {
    uVar3 = env->CP0_MemoryMapID;
  }
  pCVar4 = env->tlb;
  if (pCVar4->nb_tlb != 0) {
    lVar5 = 0x50;
    uVar6 = 0;
    do {
      if ((uVar2 >> 0x11 & 1) == 0) {
        uVar7 = (uint)*(ushort *)((long)pCVar4 + lVar5 + -8);
      }
      else {
        uVar7 = *(uint *)((long)pCVar4 + lVar5 + -4);
      }
      uVar1 = *(ushort *)((long)&pCVar4->nb_tlb + lVar5);
      if (((uVar1 & 1) == 0) && (uVar7 == uVar3)) {
        *(ushort *)((long)&pCVar4->nb_tlb + lVar5) = uVar1 | 0x8000;
      }
      uVar6 = uVar6 + 1;
      pCVar4 = env->tlb;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < pCVar4->nb_tlb);
    cpu_mips_tlb_flush_mipsel(env);
    return;
  }
  cpu_mips_tlb_flush_mipsel(env);
  return;
}

Assistant:

void r4k_helper_tlbinv(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;
    for (idx = 0; idx < env->tlb->nb_tlb; idx++) {
        tlb = &env->tlb->mmu.r4k.tlb[idx];
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if (!tlb->G && tlb_mmid == MMID) {
            tlb->EHINV = 1;
        }
    }
    cpu_mips_tlb_flush(env);
}